

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestBase.cpp
# Opt level: O1

void * Tests::FindVar(char *name)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  
  lVar2 = symbols;
  lVar1 = varInfo;
  uVar5 = (ulong)variableCount;
  if (uVar5 != 0) {
    lVar4 = 0;
    do {
      iVar3 = strcmp(name,(char *)((ulong)*(uint *)(lVar1 + lVar4) + lVar2));
      if (iVar3 == 0) {
        return (void *)((ulong)*(uint *)(lVar1 + 0xc + lVar4) + varData);
      }
      lVar4 = lVar4 + 0x10;
    } while (uVar5 << 4 != lVar4);
  }
  return (void *)0x0;
}

Assistant:

void* Tests::FindVar(const char* name)
{
	for(unsigned int i = 0; i < variableCount; i++)
	{
		if(strcmp(name, symbols + varInfo[i].offsetToName) == 0)
			return (void*)(varData + varInfo[i].offset);
	}
	return NULL;
}